

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

int8_t __thiscall
icu_63::numparse::impl::AffixMatcher::compareTo(AffixMatcher *this,AffixMatcher *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  AffixMatcher *lhs;
  AffixMatcher *rhs_local;
  AffixMatcher *this_local;
  
  iVar1 = anon_unknown.dwarf_19932b::length(this->fPrefix);
  iVar2 = anon_unknown.dwarf_19932b::length(rhs->fPrefix);
  if (iVar1 == iVar2) {
    iVar1 = anon_unknown.dwarf_19932b::length(this->fSuffix);
    iVar2 = anon_unknown.dwarf_19932b::length(rhs->fSuffix);
    if (iVar1 == iVar2) {
      this_local._7_1_ = '\0';
    }
    else {
      iVar1 = anon_unknown.dwarf_19932b::length(this->fSuffix);
      iVar2 = anon_unknown.dwarf_19932b::length(rhs->fSuffix);
      this_local._7_1_ = '\x01';
      if (iVar2 < iVar1) {
        this_local._7_1_ = -1;
      }
    }
  }
  else {
    iVar1 = anon_unknown.dwarf_19932b::length(this->fPrefix);
    iVar2 = anon_unknown.dwarf_19932b::length(rhs->fPrefix);
    this_local._7_1_ = '\x01';
    if (iVar2 < iVar1) {
      this_local._7_1_ = -1;
    }
  }
  return this_local._7_1_;
}

Assistant:

int8_t AffixMatcher::compareTo(const AffixMatcher& rhs) const {
    const AffixMatcher& lhs = *this;
    if (length(lhs.fPrefix) != length(rhs.fPrefix)) {
        return length(lhs.fPrefix) > length(rhs.fPrefix) ? -1 : 1;
    } else if (length(lhs.fSuffix) != length(rhs.fSuffix)) {
        return length(lhs.fSuffix) > length(rhs.fSuffix) ? -1 : 1;
    } else {
        return 0;
    }
}